

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O1

void av1_highbd_dr_prediction_z3_c
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_left,int dx,int dy,int bd)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint16_t *puVar9;
  int iVar10;
  long lVar11;
  uint16_t *local_48;
  
  if (0 < bw) {
    bVar4 = (byte)upsample_left;
    lVar7 = (long)(bw + bh + -1 << (bVar4 & 0x1f));
    lVar11 = (long)(1 << (bVar4 & 0x1f));
    uVar3 = 0;
    iVar10 = dy;
    local_48 = dst;
    do {
      if (0 < bh) {
        uVar8 = (uint)(iVar10 << (bVar4 & 0x1f)) >> 1 & 0x1f;
        uVar6 = 0;
        lVar2 = (long)(iVar10 >> (6 - bVar4 & 0x1f));
        uVar5 = (ulong)(uint)bh;
        puVar9 = local_48;
        do {
          lVar1 = lVar2 + lVar11;
          if (lVar7 <= lVar1 - lVar11) {
            if ((int)uVar6 < bh) {
              do {
                *puVar9 = left[lVar7];
                puVar9 = puVar9 + stride;
                uVar5 = uVar5 - 1;
              } while (uVar5 != 0);
            }
            break;
          }
          uVar6 = uVar6 + 1;
          *puVar9 = (uint16_t)
                    (left[lVar2 + 1] * uVar8 + (uint)left[lVar2] * (0x20 - uVar8) + 0x10 >> 5);
          puVar9 = puVar9 + stride;
          uVar5 = uVar5 - 1;
          lVar2 = lVar1;
        } while ((uint)bh != uVar6);
      }
      uVar3 = uVar3 + 1;
      iVar10 = iVar10 + dy;
      local_48 = local_48 + 1;
    } while (uVar3 != (uint)bw);
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z3_c(uint16_t *dst, ptrdiff_t stride, int bw,
                                   int bh, const uint16_t *above,
                                   const uint16_t *left, int upsample_left,
                                   int dx, int dy, int bd) {
  int r, c, y, base, shift, val;

  (void)above;
  (void)dx;
  (void)bd;
  assert(dx == 1);
  assert(dy > 0);

  const int max_base_y = (bw + bh - 1) << upsample_left;
  const int frac_bits = 6 - upsample_left;
  const int base_inc = 1 << upsample_left;
  y = dy;
  for (c = 0; c < bw; ++c, y += dy) {
    base = y >> frac_bits;
    shift = ((y << upsample_left) & 0x3F) >> 1;

    for (r = 0; r < bh; ++r, base += base_inc) {
      if (base < max_base_y) {
        val = left[base] * (32 - shift) + left[base + 1] * shift;
        dst[r * stride + c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        for (; r < bh; ++r) dst[r * stride + c] = left[max_base_y];
        break;
      }
    }
  }
}